

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_16a02::InstrumentMemoryAccesses::doInitialization
          (InstrumentMemoryAccesses *this,Module *M)

{
  pointer ppTVar1;
  LLVMContext *pLVar2;
  PointerType *pPVar3;
  IntegerType *pIVar4;
  raw_ostream *this_00;
  StringRef SVar5;
  StringRef SVar6;
  StringRef local_b0;
  undefined1 local_a0 [16];
  StringRef local_90;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  FunctionType *LoadStoreFuncType;
  PointerType *local_60;
  IntegerType *local_58 [3];
  PointerType *local_40;
  undefined1 local_38 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> params;
  Type *VoidTy;
  Module *M_local;
  InstrumentMemoryAccesses *this_local;
  
  pLVar2 = llvm::Module::getContext(M);
  params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)llvm::Type::getVoidTy(pLVar2);
  pLVar2 = llvm::Module::getContext(M);
  pPVar3 = (PointerType *)llvm::Type::getInt8PtrTy(pLVar2,0);
  this->VoidPtrTy = pPVar3;
  pLVar2 = llvm::Module::getContext(M);
  pIVar4 = (IntegerType *)llvm::Type::getInt64Ty(pLVar2);
  this->SizeTy = pIVar4;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::vector
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38);
  local_40 = this->VoidPtrTy;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38,(value_type *)&local_40
            );
  local_58[0] = this->SizeTy;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38,(value_type *)local_58)
  ;
  local_60 = this->VoidPtrTy;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38,(value_type *)&local_60
            );
  LoadStoreFuncType = (FunctionType *)this->SizeTy;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38,
             (value_type *)&LoadStoreFuncType);
  ppTVar1 = params.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  llvm::ArrayRef<llvm::Type*>::ArrayRef<std::allocator<llvm::Type*>>
            ((ArrayRef<llvm::Type*> *)&local_80,
             (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38);
  local_70 = llvm::FunctionType::get(ppTVar1,local_80,local_78,0);
  llvm::StringRef::StringRef(&local_90,"__loadcheck");
  SVar5.Length = (size_t)local_90.Data;
  SVar5.Data = (char *)M;
  local_a0 = llvm::Module::getOrInsertFunction(SVar5,(FunctionType *)local_90.Length);
  llvm::StringRef::StringRef(&local_b0,"__storecheck");
  SVar6.Length = (size_t)local_b0.Data;
  SVar6.Data = (char *)M;
  llvm::Module::getOrInsertFunction(SVar6,(FunctionType *)local_b0.Length);
  this_00 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(this_00,"[+] doInitialization done \n");
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~vector
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_38);
  return true;
}

Assistant:

bool InstrumentMemoryAccesses::doInitialization(Module &M) {
    Type *VoidTy = Type::getVoidTy(M.getContext());
    VoidPtrTy = Type::getInt8PtrTy(M.getContext());
    SizeTy = IntegerType::getInt64Ty(M.getContext());
    std::vector<Type*> params;
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    params.push_back(VoidPtrTy);
    params.push_back(SizeTy);
    FunctionType *LoadStoreFuncType = FunctionType::get(VoidTy,params,false);
    M.getOrInsertFunction("__loadcheck", LoadStoreFuncType);
    M.getOrInsertFunction("__storecheck", LoadStoreFuncType);
    errs() << "[+] doInitialization done \n";
    return true;
}